

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O0

void __thiscall
matrix_sparse_row_test_iterators_Test::~matrix_sparse_row_test_iterators_Test
          (matrix_sparse_row_test_iterators_Test *this)

{
  matrix_sparse_row_test_iterators_Test *this_local;
  
  ~matrix_sparse_row_test_iterators_Test(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, iterators) {
  Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 2);

  auto it = row.begin();  // start of row 0
  EXPECT_EQ((*it).i_column(), 1);
  EXPECT_DOUBLE_EQ((*it).value(), 3.0);

  ++it;  // start of row 1
  EXPECT_EQ((*it).i_column(), 3);
  EXPECT_DOUBLE_EQ((*it).value(), 4.0);

  ++it;  // start of row 2
  EXPECT_EQ((*it).i_column(), 4);
  EXPECT_DOUBLE_EQ((*it).value(), 5.0);

  ++it;  // one past last row
  EXPECT_EQ(it, row.end());
}